

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::protos::gen::ConsumerPortProxy::DisableTracing
          (ConsumerPortProxy *this,DisableTracingRequest *request,
          DeferredDisableTracingResponse *reply,int fd)

{
  _Any_data local_98;
  long local_88;
  undefined8 local_80;
  string local_78;
  _Any_data local_58;
  long local_48;
  undefined8 uStack_40;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"DisableTracing","");
  local_48 = 0;
  uStack_40 = 0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  ipc::DeferredBase::Move((DeferredBase *)&local_58,&reply->super_DeferredBase);
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_88 = 0;
  local_80 = uStack_40;
  if (local_48 != 0) {
    local_98._M_unused._M_object = local_58._M_unused._M_object;
    local_98._8_8_ = local_58._8_8_;
    local_88 = local_48;
    local_48 = 0;
    uStack_40 = 0;
  }
  ipc::ServiceProxy::BeginInvoke
            (&this->super_ServiceProxy,&local_78,&request->super_CppMessageObj,
             (DeferredBase *)&local_98,fd);
  ipc::DeferredBase::~DeferredBase((DeferredBase *)&local_98);
  ipc::DeferredBase::~DeferredBase((DeferredBase *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ConsumerPortProxy::DisableTracing(const DisableTracingRequest& request, DeferredDisableTracingResponse reply, int fd) {
  BeginInvoke("DisableTracing", request, ::perfetto::ipc::DeferredBase(std::move(reply)),
              fd);
}